

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong uVar1;
  long *plVar2;
  ulong *puVar3;
  undefined1 *puVar4;
  TestError *pTVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  long lVar13;
  string *psVar14;
  ulong uVar15;
  ulong uVar16;
  ulong local_110;
  long *local_108;
  long local_f8;
  long lStack_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string base_variable_string;
  string base_var_type;
  string shader_source;
  
  lVar13 = 0;
  do {
    lVar6 = 0x222cb38;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar6 = 0x222cb38;
      lVar7 = supported_variable_types_map._16_8_;
      do {
        if (*(int *)(Interface::GL::var_types + lVar13 * 4) <= *(int *)(lVar7 + 0x20)) {
          lVar6 = lVar7;
        }
        lVar7 = *(long *)(lVar7 + 0x10 +
                         (ulong)(*(int *)(lVar7 + 0x20) <
                                *(int *)(Interface::GL::var_types + lVar13 * 4)) * 8);
      } while (lVar7 != 0);
    }
    lVar7 = 0x222cb38;
    if ((lVar6 != 0x222cb38) &&
       (lVar7 = lVar6, *(int *)(Interface::GL::var_types + lVar13 * 4) < *(int *)(lVar6 + 0x20))) {
      lVar7 = 0x222cb38;
    }
    if (lVar7 == 0x222cb38) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x529);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    uVar16 = 2;
    local_110 = 3;
    do {
      base_var_type._M_dataplus._M_p = (pointer)&base_var_type.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&base_var_type,*(long *)(lVar7 + 0x28),
                 *(long *)(lVar7 + 0x30) + *(long *)(lVar7 + 0x28));
      base_variable_string._M_dataplus._M_p = (pointer)&base_variable_string.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&base_variable_string,base_var_type._M_dataplus._M_p,
                 base_var_type._M_dataplus._M_p + base_var_type._M_string_length);
      uVar15 = 0;
      do {
        shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&shader_source,0x1b32ab9);
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__str,shader_start_abi_cxx11_,DAT_02227518 + shader_start_abi_cxx11_);
        std::__cxx11::string::append((char *)&__str);
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&__str,(ulong)base_variable_string._M_dataplus._M_p);
        local_c8 = &local_b8;
        plVar8 = plVar2 + 2;
        if ((long *)*plVar2 == plVar8) {
          local_b8 = *plVar8;
          lStack_b0 = plVar2[3];
        }
        else {
          local_b8 = *plVar8;
          local_c8 = (long *)*plVar2;
        }
        local_c0 = plVar2[1];
        *plVar2 = (long)plVar8;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_108 = &local_f8;
        plVar8 = plVar2 + 2;
        if ((long *)*plVar2 == plVar8) {
          local_f8 = *plVar8;
          lStack_f0 = plVar2[3];
        }
        else {
          local_f8 = *plVar8;
          local_108 = (long *)*plVar2;
        }
        *plVar2 = (long)plVar8;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_108);
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        uVar1 = uVar15;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        for (; uVar1 < uVar16; uVar1 = uVar1 + 1) {
          std::__cxx11::string::append((char *)&shader_source);
        }
        std::__cxx11::string::append((char *)&shader_source);
        if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,"Unrecognized shader type.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x51d);
          __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        puVar3 = &set_tesseation_abi_cxx11_;
        switch(tested_shader_type) {
        case VERTEX_SHADER_TYPE:
          std::__cxx11::string::append((char *)&shader_source);
          break;
        case GEOMETRY_SHADER_TYPE:
          puVar3 = &emit_quad_abi_cxx11_;
        case TESSELATION_CONTROL_SHADER_TYPE:
          std::__cxx11::string::_M_append((char *)&shader_source,*puVar3);
        }
        std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
        puVar11 = empty_string_abi_cxx11_;
        puVar10 = empty_string_abi_cxx11_;
        puVar9 = empty_string_abi_cxx11_;
        puVar12 = empty_string_abi_cxx11_;
        puVar4 = (undefined1 *)&shader_source;
        psVar14 = (string *)empty_string_abi_cxx11_;
        switch(tested_shader_type) {
        case FRAGMENT_SHADER_TYPE:
          puVar4 = empty_string_abi_cxx11_;
          puVar11 = default_vertex_shader_source_abi_cxx11_;
          puVar10 = default_tc_shader_source_abi_cxx11_;
          puVar9 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
          puVar12 = default_geometry_shader_source_abi_cxx11_;
          psVar14 = &shader_source;
          break;
        case VERTEX_SHADER_TYPE:
          puVar10 = default_tc_shader_source_abi_cxx11_;
          puVar11 = (undefined1 *)&shader_source;
          goto LAB_00b4db4f;
        case COMPUTE_SHADER_TYPE:
          break;
        case GEOMETRY_SHADER_TYPE:
          puVar11 = default_vertex_shader_source_abi_cxx11_;
          puVar10 = default_tc_shader_source_abi_cxx11_;
          puVar9 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
          puVar12 = (undefined1 *)&shader_source;
          goto LAB_00b4db90;
        case TESSELATION_CONTROL_SHADER_TYPE:
          puVar10 = (undefined1 *)&shader_source;
          puVar11 = default_vertex_shader_source_abi_cxx11_;
LAB_00b4db4f:
          puVar9 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
LAB_00b4db89:
          puVar12 = default_geometry_shader_source_abi_cxx11_;
LAB_00b4db90:
          puVar4 = empty_string_abi_cxx11_;
          psVar14 = (string *)default_fragment_shader_source_abi_cxx11_;
          break;
        case TESSELATION_EVALUATION_SHADER_TYPE:
          puVar11 = default_vertex_shader_source_abi_cxx11_;
          puVar10 = default_tc_shader_source_abi_cxx11_;
          puVar9 = (undefined1 *)&shader_source;
          goto LAB_00b4db89;
        default:
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,"Invalid enum",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x520);
          __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
          super_TestNode._vptr_TestNode[10])(this,puVar11,puVar10,puVar9,puVar12,psVar14,puVar4,1,0)
        ;
        std::__cxx11::string::append((char *)&base_variable_string);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
          operator_delete(shader_source._M_dataplus._M_p,
                          shader_source.field_2._M_allocated_capacity + 1);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)base_variable_string._M_dataplus._M_p != &base_variable_string.field_2) {
        operator_delete(base_variable_string._M_dataplus._M_p,
                        base_variable_string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)base_var_type._M_dataplus._M_p != &base_var_type.field_2) {
        operator_delete(base_var_type._M_dataplus._M_p,
                        base_var_type.field_2._M_allocated_capacity + 1);
      }
      uVar16 = uVar16 + 1;
      local_110 = local_110 + 1;
    } while (local_110 != 10);
    lVar13 = lVar13 + 1;
    if (lVar13 == 0x29) {
      return;
    }
  } while( true );
}

Assistant:

void SizedDeclarationsPrimitive<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	for (size_t var_type_index = 0; var_type_index < API::n_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			/* Loop round for each var_types ("int", "uint", "float", etc.)
			 * We are testing a[][] to a [][][][][][][][], so start counter at 2. */
			for (size_t max_dimension_limit = 2; max_dimension_limit <= API::MAX_ARRAY_DIMENSIONS;
				 max_dimension_limit++)
			{
				// Record the base varTypeModifier + varType
				std::string base_var_type		 = var_iterator->second.type;
				std::string base_variable_string = base_var_type;

				for (size_t base_sub_script_index = 0; base_sub_script_index <= max_dimension_limit;
					 base_sub_script_index++)
				{
					std::string shader_source = "";

					// Add the shader body start, and the base varTypeModifier + varType + variable name.
					shader_source += shader_start + "    " + base_variable_string + " a";

					for (size_t remaining_sub_script_index = base_sub_script_index;
						 remaining_sub_script_index < max_dimension_limit; remaining_sub_script_index++)
					{
						/* Add as many array sub_scripts as we can, up to the current dimension limit. */
						shader_source += "[2]";
					}

					/* End line */
					shader_source += ";\n";

					/* End main */
					DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

					/* Execute test */
					EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);

					/* From now on, we'll have an extra sub_script each time. */
					base_variable_string += "[2]";
				} /* for (int base_sub_script_index = 0; ...) */
			}	 /* for (int max_dimension_limit = 2; ...) */
		}		  /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}